

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O3

uint addChunk_IHDR(ucvector *out,uint w,uint h,LodePNGColorType colortype,uint bitdepth,
                  uint interlace_method)

{
  ucvector *out_00;
  uchar *puVar1;
  size_t sVar2;
  uint uVar3;
  uint extraout_EAX;
  uchar *puVar4;
  uchar *puVar5;
  size_t sVar6;
  ulong uVar7;
  ulong uVar8;
  size_t sVar9;
  ulong uVar10;
  ulong uVar11;
  ucvector local_68;
  ulong local_48;
  uint local_3c;
  ucvector *local_38;
  
  local_48 = CONCAT44(local_48._4_4_,colortype);
  local_68.data = (uchar *)0x0;
  local_68.size = 0;
  local_68.allocsize = 0;
  local_3c = interlace_method;
  local_38 = out;
  lodepng_add32bitInt(&local_68,w);
  lodepng_add32bitInt(&local_68,h);
  sVar9 = local_68.allocsize;
  sVar6 = local_68.size;
  puVar5 = local_68.data;
  uVar7 = local_68.size + 1;
  puVar4 = local_68.data;
  uVar11 = local_68.allocsize;
  if (local_68.allocsize < uVar7) {
    uVar11 = uVar7 * 3 >> 1;
    if (local_68.allocsize * 2 < uVar7) {
      uVar11 = uVar7;
    }
    puVar4 = (uchar *)realloc(local_68.data,uVar11);
    if (puVar4 != (uchar *)0x0) goto LAB_0010d32c;
  }
  else {
LAB_0010d32c:
    local_68.allocsize = uVar11;
    local_68.data = puVar4;
    local_68.data[sVar6] = (uchar)bitdepth;
    uVar11 = sVar6 + 2;
    sVar6 = uVar7;
    uVar7 = uVar11;
    sVar9 = local_68.allocsize;
    puVar5 = local_68.data;
  }
  out_00 = local_38;
  puVar4 = puVar5;
  puVar1 = local_68.data;
  uVar11 = local_68.allocsize;
  if (sVar9 < uVar7) {
    uVar11 = uVar7 * 3 >> 1;
    if (sVar9 * 2 < uVar7) {
      uVar11 = uVar7;
    }
    puVar4 = (uchar *)realloc(puVar5,uVar11);
    uVar8 = uVar7;
    puVar1 = puVar4;
    if (puVar4 != (uchar *)0x0) goto LAB_0010d376;
  }
  else {
LAB_0010d376:
    local_68.allocsize = uVar11;
    local_68.data = puVar1;
    puVar4[uVar7 - 1] = (uchar)local_48;
    uVar8 = uVar7 + 1;
    sVar9 = local_68.allocsize;
    sVar6 = uVar7;
    puVar5 = local_68.data;
    local_68.size = uVar7;
  }
  uVar7 = sVar9;
  puVar4 = puVar5;
  puVar1 = local_68.data;
  sVar2 = local_68.allocsize;
  if (sVar9 < uVar8) {
    uVar7 = uVar8 * 3 >> 1;
    if (sVar9 * 2 < uVar8) {
      uVar7 = uVar8;
    }
    local_48 = sVar6;
    puVar4 = (uchar *)realloc(puVar5,uVar7);
    uVar11 = local_48;
    puVar1 = puVar4;
    sVar2 = uVar7;
    if (puVar4 != (uchar *)0x0) goto LAB_0010d3da;
  }
  else {
LAB_0010d3da:
    local_68.allocsize = sVar2;
    local_68.data = puVar1;
    puVar4[uVar8 - 1] = '\0';
    uVar11 = uVar8;
    sVar9 = uVar7;
    uVar8 = uVar8 + 1;
    puVar5 = puVar4;
  }
  puVar4 = local_68.data;
  uVar7 = local_68.allocsize;
  if (sVar9 < uVar8) {
    uVar7 = uVar8 * 3 >> 1;
    if (sVar9 * 2 < uVar8) {
      uVar7 = uVar8;
    }
    puVar5 = (uchar *)realloc(puVar5,uVar7);
    uVar10 = uVar8;
    puVar4 = puVar5;
    if (puVar5 != (uchar *)0x0) goto LAB_0010d422;
  }
  else {
LAB_0010d422:
    local_68.allocsize = uVar7;
    local_68.data = puVar4;
    puVar5[uVar8 - 1] = '\0';
    uVar10 = uVar8 + 1;
    uVar11 = uVar8;
    sVar9 = local_68.allocsize;
    local_68.size = uVar8;
  }
  puVar5 = local_68.data;
  puVar4 = local_68.data;
  if (sVar9 < uVar10) {
    uVar7 = uVar10 * 3 >> 1;
    if (sVar9 * 2 < uVar10) {
      uVar7 = uVar10;
    }
    puVar4 = (uchar *)realloc(local_68.data,uVar7);
    if (puVar4 == (uchar *)0x0) goto LAB_0010d47d;
  }
  puVar4[uVar10 - 1] = (uchar)local_3c;
  uVar11 = uVar10;
  puVar5 = puVar4;
LAB_0010d47d:
  uVar3 = lodepng_chunk_create(&out_00->data,&out_00->size,(uint)uVar11,"IHDR",puVar5);
  if (uVar3 == 0) {
    out_00->allocsize = out_00->size;
  }
  free(puVar5);
  return extraout_EAX;
}

Assistant:

static unsigned addChunk_IHDR(ucvector* out, unsigned w, unsigned h,
                              LodePNGColorType colortype, unsigned bitdepth, unsigned interlace_method)
{
  unsigned error = 0;
  ucvector header;
  ucvector_init(&header);

  lodepng_add32bitInt(&header, w); /*width*/
  lodepng_add32bitInt(&header, h); /*height*/
  ucvector_push_back(&header, (unsigned char)bitdepth); /*bit depth*/
  ucvector_push_back(&header, (unsigned char)colortype); /*color type*/
  ucvector_push_back(&header, 0); /*compression method*/
  ucvector_push_back(&header, 0); /*filter method*/
  ucvector_push_back(&header, interlace_method); /*interlace method*/

  error = addChunk(out, "IHDR", header.data, header.size);
  ucvector_cleanup(&header);

  return error;
}